

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t_const&>
          (SmallVectorBase<slang::logic_t> *this,logic_t *args)

{
  size_type sVar1;
  ulong uVar2;
  pointer p;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  size_type sVar6;
  pointer __src;
  ulong n;
  long lVar7;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    __src->value = args->value;
    sVar1 = this->len;
    this->len = sVar1 + 1;
    return this->data_ + sVar1;
  }
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = this->len + 1;
  uVar2 = this->cap;
  if (n < uVar2 * 2) {
    n = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    n = 0x7fffffffffffffff;
  }
  lVar7 = (long)__src - (long)this->data_;
  plVar5 = (pointer)operator_new(n);
  plVar5[lVar7].value = args->value;
  p = this->data_;
  sVar1 = this->len;
  plVar3 = p;
  plVar4 = plVar5;
  if (p + (sVar1 - (long)__src) == (pointer)0x0) {
    if (sVar1 != 0) {
      sVar6 = 0;
      do {
        plVar5[sVar6].value = p[sVar6].value;
        sVar6 = sVar6 + 1;
      } while (sVar1 != sVar6);
    }
  }
  else {
    for (; plVar3 != __src; plVar3 = plVar3 + 1) {
      plVar4->value = plVar3->value;
      plVar4 = plVar4 + 1;
    }
    memcpy(plVar5 + lVar7 + 1,__src,(size_t)(p + (sVar1 - (long)__src)));
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = n;
  this->data_ = plVar5;
  return plVar5 + lVar7;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }